

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall TestSkipInternal::Run(TestSkipInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> *in_RDX;
  string local_58;
  testinator local_38 [8];
  char *local_30;
  undefined4 local_28;
  
  pOVar1 = (this->super_Test).m_op;
  local_30 = "Hello world ";
  local_28 = 0x2a;
  testinator::Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,int>>>
            (&local_58,local_38,in_RDX);
  (*pOVar1->_vptr_Outputter[1])(pOVar1,&(this->super_Test).m_name,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).m_skipped = true;
  return false;
}

Assistant:

virtual bool Run()
  {
    SKIP("Hello world " << 42);
    return false;
  }